

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cCopyImageTests.cpp
# Opt level: O2

IterateResult __thiscall
gl4cts::CopyImage::SamplesMissMatchTest::iterate(SamplesMissMatchTest *this)

{
  ostringstream *stream;
  pointer ptVar1;
  ostringstream *this_00;
  GLenum GVar2;
  pointer ptVar3;
  int iVar4;
  GLuint GVar5;
  GLenum GVar6;
  IterateResult IVar7;
  undefined4 extraout_var;
  MessageBuilder *pMVar8;
  uint uVar9;
  Enum<int,_2UL> local_1f0;
  Enum<int,_2UL> local_1e0;
  Enum<int,_2UL> local_1d0;
  Enum<int,_2UL> local_1c0;
  undefined1 local_1b0 [384];
  
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  uVar9 = this->m_test_case_index;
  ptVar3 = (this->m_test_cases).
           super__Vector_base<gl4cts::CopyImage::SamplesMissMatchTest::testCase,_std::allocator<gl4cts::CopyImage::SamplesMissMatchTest::testCase>_>
           ._M_impl.super__Vector_impl_data._M_start;
  GVar5 = Utils::prepareMultisampleTex
                    ((this->super_TestCase).m_context,ptVar3[uVar9].m_dst_target,
                     ptVar3[uVar9].m_dst_n_samples);
  ptVar1 = ptVar3 + uVar9;
  this->m_dst_tex_name = GVar5;
  GVar5 = Utils::prepareMultisampleTex
                    ((this->super_TestCase).m_context,ptVar1->m_src_target,ptVar1->m_src_n_samples);
  this->m_src_tex_name = GVar5;
  (**(code **)(CONCAT44(extraout_var,iVar4) + 0x310))
            (GVar5,ptVar1->m_src_target,0,0,0,0,this->m_dst_tex_name,ptVar1->m_dst_target,0,0,0,0,1,
             1,1);
  GVar6 = (**(code **)(CONCAT44(extraout_var,iVar4) + 0x800))();
  GVar2 = ptVar1->m_expected_result;
  clean(this);
  if (GVar2 == GVar6) {
    tcu::TestContext::setTestResult
              (((this->super_TestCase).m_context)->m_testCtx,QP_TEST_RESULT_PASS,"Pass");
    uVar9 = this->m_test_case_index + 1;
    this->m_test_case_index = uVar9;
    IVar7 = (IterateResult)
            ((ulong)uVar9 <
            (ulong)(((long)(this->m_test_cases).
                           super__Vector_base<gl4cts::CopyImage::SamplesMissMatchTest::testCase,_std::allocator<gl4cts::CopyImage::SamplesMissMatchTest::testCase>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->m_test_cases).
                          super__Vector_base<gl4cts::CopyImage::SamplesMissMatchTest::testCase,_std::allocator<gl4cts::CopyImage::SamplesMissMatchTest::testCase>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 0x14));
  }
  else {
    local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    this_00 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::operator<<((ostream *)this_00,"Failure. Expected result: ");
    local_1c0.m_value = ptVar1->m_expected_result;
    local_1c0.m_getName = glu::getErrorName;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1c0,(ostream *)this_00);
    std::operator<<((ostream *)this_00," got: ");
    local_1d0.m_getName = glu::getErrorName;
    local_1d0.m_value = GVar6;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1d0,(ostream *)this_00);
    std::operator<<((ostream *)this_00,". Source target: ");
    local_1e0.m_value = ptVar1->m_src_target;
    local_1e0.m_getName = glu::getTextureTargetName;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1e0,(ostream *)this_00);
    std::operator<<((ostream *)this_00," samples: ");
    pMVar8 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,&ptVar1->m_src_n_samples);
    stream = &pMVar8->m_str;
    std::operator<<(&stream->super_basic_ostream<char,_std::char_traits<char>_>,
                    ", destination target: ");
    local_1f0.m_value = ptVar1->m_dst_target;
    local_1f0.m_getName = glu::getTextureTargetName;
    tcu::Format::Enum<int,_2UL>::toStream
              (&local_1f0,&stream->super_basic_ostream<char,_std::char_traits<char>_>);
    std::operator<<(&stream->super_basic_ostream<char,_std::char_traits<char>_>," samples: ");
    pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&ptVar3[uVar9].m_dst_n_samples);
    tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    tcu::TestContext::setTestResult
              (((this->super_TestCase).m_context)->m_testCtx,QP_TEST_RESULT_FAIL,"Fail");
    IVar7 = STOP;
  }
  return IVar7;
}

Assistant:

tcu::TestNode::IterateResult SamplesMissMatchTest::iterate()
{
	GLenum						 error	 = GL_NO_ERROR;
	const Functions&			 gl		   = m_context.getRenderContext().getFunctions();
	tcu::TestNode::IterateResult it_result = tcu::TestNode::STOP;
	bool						 result	= false;
	const testCase&				 test_case = m_test_cases[m_test_case_index];

	try
	{
		/* Prepare textures */
		m_dst_tex_name = Utils::prepareMultisampleTex(m_context, test_case.m_dst_target, test_case.m_dst_n_samples);
		m_src_tex_name = Utils::prepareMultisampleTex(m_context, test_case.m_src_target, test_case.m_src_n_samples);
	}
	catch (tcu::Exception& exc)
	{
		clean();
		throw exc;
	}

	/* Execute CopyImageSubData */
	gl.copyImageSubData(m_src_tex_name, test_case.m_src_target, 0 /* srcLevel */, 0 /* srcX */, 0 /* srcY */,
						0 /* srcZ */, m_dst_tex_name, test_case.m_dst_target, 0 /* dstLevel */, 0 /* dstX */,
						0 /* dstY */, 0 /* dstZ */, 1 /* srcWidth */, 1 /* srcHeight */, 1 /* srcDepth */);

	/* Verify generated error */
	error  = gl.getError();
	result = (test_case.m_expected_result == error);

	/* Free resources */
	clean();

	/* Set result */
	if (true == result)
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_PASS, "Pass");

		/* Increase index */
		m_test_case_index += 1;

		/* Are there any test cases left */
		if (m_test_cases.size() > m_test_case_index)
		{
			it_result = tcu::TestNode::CONTINUE;
		}
	}
	else
	{
		m_context.getTestContext().getLog()
			<< tcu::TestLog::Message << "Failure. Expected result: " << glu::getErrorStr(test_case.m_expected_result)
			<< " got: " << glu::getErrorStr(error)
			<< ". Source target: " << glu::getTextureTargetStr(test_case.m_src_target)
			<< " samples: " << test_case.m_src_n_samples
			<< ", destination target: " << glu::getTextureTargetStr(test_case.m_dst_target)
			<< " samples: " << test_case.m_dst_n_samples << tcu::TestLog::EndMessage;

		m_context.getTestContext().setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	/* Done */
	return it_result;
}